

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_RH_ENABLES_Unmarshal(TPMI_RH_ENABLES *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_RH_ENABLES TVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT32_Unmarshal(target,buffer,size);
  if ((TVar2 == 0) &&
     (((TVar1 = *target, TVar1 + 0xbffffff5 < 3 || (TVar1 == 0x40000001)) ||
      ((TVar2 = 0x84, TVar1 == 0x40000007 && (flag != 0)))))) {
    TVar2 = 0;
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_RH_ENABLES_Unmarshal(TPMI_RH_ENABLES *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_PLATFORM:
        case TPM_RH_ENDORSEMENT:
        case TPM_RH_PLATFORM_NV:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}